

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QString * QUtf8::convertToUnicode(QString *__return_storage_ptr__,QByteArrayView in,State *state)

{
  char16_t *buffer;
  QUtf8 *this;
  char16_t *pcVar1;
  char16_t *pcVar2;
  State *in_R8;
  QByteArrayView in_00;
  __off_t __length;
  
  in_00.m_size = in.m_data;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,(long)in.m_size + 1,Uninitialized);
  this = (QUtf8 *)QString::data(__return_storage_ptr__);
  in_00.m_data = (storage_type *)state;
  pcVar1 = convertToUnicode(this,(char16_t *)in.m_size,in_00,in_R8);
  pcVar2 = (__return_storage_ptr__->d).ptr;
  if (pcVar2 == (char16_t *)0x0) {
    pcVar2 = L"";
  }
  QString::truncate(__return_storage_ptr__,(char *)((long)pcVar1 - (long)pcVar2 >> 1),__length);
  return __return_storage_ptr__;
}

Assistant:

QString QUtf8::convertToUnicode(QByteArrayView in, QStringConverter::State *state)
{
    // See above for buffer requirements for stateless decoding. However, that
    // fails if the state is not empty. The following situations can add to the
    // requirements:
    //  state contains      chars starts with           requirement
    //   1 of 2 bytes       valid continuation          0
    //   2 of 3 bytes       same                        0
    //   3 bytes of 4       same                        +1 (need to insert surrogate pair)
    //   1 of 2 bytes       invalid continuation        +1 (need to insert replacement and restart)
    //   2 of 3 bytes       same                        +1 (same)
    //   3 of 4 bytes       same                        +1 (same)
    QString result(in.size() + 1, Qt::Uninitialized);
    QChar *end = convertToUnicode(result.data(), in, state);
    result.truncate(end - result.constData());
    return result;
}